

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void hash_table_create(hash_table_t *table,uint initial_size,_func_int_void_ptr_void_ptr *is_equal,
                      _func_size_t_void_ptr *hash)

{
  void *pvVar1;
  void *__ptr;
  int iVar2;
  hash_table_bucket_t *phVar3;
  hash_table_bucket_t *phVar4;
  uint x;
  ulong uVar5;
  undefined8 *__nmemb;
  uint x_00;
  
  if (initial_size < 3) {
    initial_size = 2;
  }
  table->n_items = 0;
  x_00 = initial_size - 1;
  iVar2 = uint32_log2(x_00);
  x = 2 << ((byte)iVar2 & 0x1f);
  table->n_buckets = x;
  __nmemb = (undefined8 *)(ulong)(uint)(4 << ((byte)iVar2 & 0x1f));
  phVar3 = (hash_table_bucket_t *)calloc((size_t)__nmemb,0x10);
  table->allocs = phVar3;
  if (phVar3 == (hash_table_bucket_t *)0x0) {
    hash_table_create_cold_1();
    __ptr = (void *)__nmemb[3];
    while (__ptr != (void *)0x0) {
      pvVar1 = *(void **)((long)__ptr + 8);
      free(__ptr);
      __nmemb[3] = pvVar1;
      __ptr = pvVar1;
    }
    __nmemb[4] = 0;
    __nmemb[5] = 0;
    __nmemb[2] = 0;
    __nmemb[3] = 0;
    *__nmemb = 0;
    __nmemb[1] = 0;
    return;
  }
  table->buckets = phVar3 + 1;
  table->free_buckets = phVar3 + (ulong)x + 1;
  phVar4 = phVar3 + (ulong)x + 2;
  uVar5 = (ulong)x_00;
  do {
    phVar4[-1].next = phVar4;
    phVar4 = phVar4 + 1;
    uVar5 = uVar5 - 1;
  } while (uVar5 != 0);
  phVar3[(ulong)x + (ulong)x_00 + 1].next = (hash_table_bucket_t *)0x0;
  table->is_equal = is_equal;
  table->hash = hash;
  table->seed = 0x1a08ee1184ba6d32;
  iVar2 = uint32_log2(x);
  (table->ghash).mult = 0x14057b7ef7678100;
  (table->ghash).add = 0x1a08ee1184ba6d00;
  (table->ghash).log2_buckets = iVar2;
  table->max_load = 1.0;
  table->max_collisions = 5;
  return;
}

Assistant:

void hash_table_create( hash_table_t * table, unsigned initial_size,
       int (*is_equal)(const void * a, const void * b),
       size_t (*hash)(const void * x) ) 
{
    unsigned i;
    if (initial_size < 2 ) initial_size = 2;

    table->n_items = 0;
    table->n_buckets = 1u << (int_log2( initial_size-1) + 1 );
    table->allocs  
        = calloc( 2*table->n_buckets, sizeof(hash_table_bucket_t));
    if ( table->allocs == NULL) {
        fprintf( stderr, "hash_table_create: Insufficient memory\n");
        abort();
    }

    table->buckets = table->allocs + 1;
    table->free_buckets  = table->allocs + table->n_buckets + 1;
    
    /* initialize free list */
    for ( i = 0; i < initial_size - 1; ++i )
        table->free_buckets[i].next = &table->free_buckets[i+1];
    table->free_buckets[initial_size-1].next = NULL;

    table->is_equal = is_equal;
    table->hash = hash;
    table->seed = 0;
    table->ghash 
        = new_universal_hash_function( &table->seed, table->n_buckets );

    /* some configurable constants */
    table->max_load = 1.0;
    table->max_collisions = 5;
}